

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void getCompatibleInterfaceProperties
               (cmGeneratorTarget *target,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ifaceProperties,string *config)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  TargetType TVar3;
  cmComputeLinkInformation *this;
  ItemVector *pIVar4;
  cmLocalGenerator *this_00;
  ostream *poVar5;
  string *psVar6;
  pointer pIVar7;
  string sStack_1c8;
  ostringstream e;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 != OBJECT_LIBRARY) {
    this = cmGeneratorTarget::GetLinkInformation(target,config);
    if (this == (cmComputeLinkInformation *)0x0) {
      this_00 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"Exporting the target \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::operator<<(poVar5,"\" is not allowed since its linker language cannot be determined");
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    else {
      pIVar4 = cmComputeLinkInformation::GetItems(this);
      pIVar1 = (pIVar4->
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar7 = (pIVar4->
                    super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                    )._M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar1;
          pIVar7 = pIVar7 + 1) {
        pcVar2 = pIVar7->Target;
        if (pcVar2 != (cmGeneratorTarget *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&sStack_1c8);
          getPropertyContents(pcVar2,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
          pcVar2 = pIVar7->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&sStack_1c8);
          getPropertyContents(pcVar2,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
          pcVar2 = pIVar7->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator<char> *)&sStack_1c8);
          getPropertyContents(pcVar2,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
          pcVar2 = pIVar7->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator<char> *)&sStack_1c8);
          getPropertyContents(pcVar2,(string *)&e,ifaceProperties);
          std::__cxx11::string::~string((string *)&e);
        }
      }
    }
  }
  return;
}

Assistant:

void getCompatibleInterfaceProperties(cmGeneratorTarget* target,
                                      std::set<std::string>& ifaceProperties,
                                      const std::string& config)
{
  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // object libraries have no link information, so nothing to compute
    return;
  }

  cmComputeLinkInformation* info = target->GetLinkInformation(config);

  if (!info) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Exporting the target \"" << target->GetName()
      << "\" is not "
         "allowed since its linker language cannot be determined";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  const cmComputeLinkInformation::ItemVector& deps = info->GetItems();

  for (auto const& dep : deps) {
    if (!dep.Target) {
      continue;
    }
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_BOOL",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_STRING",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                        ifaceProperties);
  }
}